

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
OpenCorruptStore_HeaderFooterTooLarge_Test::~OpenCorruptStore_HeaderFooterTooLarge_Test
          (OpenCorruptStore_HeaderFooterTooLarge_Test *this)

{
  (this->super_OpenCorruptStore).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenCorruptStore_0026a490;
  in_memory_store::~in_memory_store(&(this->super_OpenCorruptStore).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (OpenCorruptStore, HeaderFooterTooLarge) {
    auto too_large = pstore::typed_address<pstore::trailer>::make (
        (UINT64_C (1) << (pstore::address::offset_number_bits +
                          pstore::address::segment_number_bits)) -
        1U);
    this->get_header ()->footer_pos = too_large;
    this->check_database_open (pstore::error_code::header_corrupt);
}